

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

VectorType * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::VectorType,(anonymous_namespace)::Node*&,StringView&>
          (Db *this,Node **args,StringView *args_1)

{
  Node *pNVar1;
  VectorType *pVVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  pVVar2 = (VectorType *)
           anon_unknown.dwarf_2dcf93::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x30);
  pNVar1 = *args;
  pcVar3 = args_1->First;
  pcVar4 = args_1->Last;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x1;
    bVar5 = pcVar3 != (char *)0x0;
    pcVar3 = (char *)0x1;
    if (bVar5) {
      __assert_fail("FirstChar == SecondChar",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                    ,0x21f,"(anonymous namespace)::NodeOrString::NodeOrString(StringView)");
    }
  }
  (pVVar2->super_Node).K = KVectorType;
  (pVVar2->super_Node).RHSComponentCache = No;
  (pVVar2->super_Node).ArrayCache = No;
  (pVVar2->super_Node).FunctionCache = No;
  (pVVar2->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001d0a88;
  pVVar2->BaseType = pNVar1;
  (pVVar2->Dimension).First = pcVar3;
  (pVVar2->Dimension).Second = pcVar4;
  pVVar2->IsPixel = false;
  return pVVar2;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }